

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

XMLNode __thiscall XMLParser::XMLNode::getChildNode(XMLNode *this,char *name,int j)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int in_ECX;
  undefined4 in_register_00000014;
  int *j_00;
  long lVar6;
  uint uVar7;
  XMLNode *A;
  long lVar8;
  long lVar9;
  int i;
  XMLNode local_38;
  
  j_00 = (int *)CONCAT44(in_register_00000014,j);
  lVar2 = *(long *)name;
  if (lVar2 == 0) {
    A = (XMLNode *)&emptyXMLNode;
  }
  else {
    if (-1 < in_ECX) {
      if (in_ECX != 0) {
        uVar7 = in_ECX + 1;
        do {
          getChildNode(&local_38,name,j_00);
          ~XMLNode(&local_38);
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      getChildNode(this,name,j_00);
      return (XMLNode)(XMLNodeData *)this;
    }
    iVar1 = *(int *)(lVar2 + 8);
    lVar9 = (long)iVar1;
    lVar8 = 0;
    lVar6 = lVar9;
    do {
      lVar6 = lVar6 + -1;
      if (lVar9 == lVar8) goto LAB_0019a91a;
      lVar3 = *(long *)(lVar2 + 0x28);
      iVar4 = strcasecmp((char *)j_00,(char *)**(undefined8 **)(lVar3 + lVar6 * 8));
      lVar8 = lVar8 + 1;
    } while (iVar4 != 0);
    uVar5 = lVar9 - lVar8;
    if ((uVar5 == 0xffffffffffffffff || (long)(uVar5 + 1) < 0) || (iVar1 < (iVar1 - (int)lVar8) + 1)
       ) {
LAB_0019a91a:
      A = (XMLNode *)&emptyXMLNode;
    }
    else {
      A = (XMLNode *)((uVar5 & 0xffffffff) * 8 + lVar3);
    }
  }
  XMLNode(this,A);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::getChildNode(XMLCSTR name, int j) const
    {
        if(!d)
            return emptyXMLNode;
        if(j >= 0)
        {
            int i = 0;
            while(j-- > 0)
                getChildNode(name, &i);
            return getChildNode(name, &i);
        }
        int i = d->nChild;
        while(i--)
            if(!xstricmp(name, d->pChild[i].d->lpszName))
                break;
        if(i < 0)
            return emptyXMLNode;
        return getChildNode(i);
    }